

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_ObjToGia2(Gia_Man_t *pNew,int fUseBuf,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp,int fUseXors)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *__assertion;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  iVar6 = (p->vObjType).nSize;
  if (iVar6 <= iObj) {
LAB_003b4813:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x2de,"int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
  }
  vTemp->nSize = 0;
  if ((p->vObjFans).nSize <= iObj) goto LAB_003b4750;
  iVar2 = (p->vObjFans).pArray[(uint)iObj];
  lVar15 = (long)iVar2;
  if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar3 = (p->vFanSto).pArray;
  if (0 < piVar3[lVar15]) {
    lVar14 = 0;
    do {
      uVar10 = piVar3[lVar15 + lVar14 + 1];
      if ((long)(int)uVar10 < 1) {
        __assertion = "i>0";
LAB_003b479e:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
      }
      uVar7 = (p->vObjCopy).nSize;
      if ((int)uVar7 < 1) {
        __assertion = "Acb_NtkHasObjCopies(p)";
        goto LAB_003b479e;
      }
      if (uVar7 <= uVar10) goto LAB_003b4750;
      iVar6 = (p->vObjCopy).pArray[(int)uVar10];
      if (iVar6 < 0) {
        __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                      ,0x2e2,
                      "int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
      }
      lVar14 = lVar14 + 1;
      Vec_IntPush(vTemp,iVar6);
    } while (lVar14 < piVar3[lVar15]);
    iVar6 = (p->vObjType).nSize;
  }
  if (iVar6 <= iObj) goto LAB_003b4813;
  bVar1 = (p->vObjType).pArray[(uint)iObj];
  if (bVar1 == 7) {
    uVar10 = 0;
  }
  else if (bVar1 == 8) {
    uVar10 = 1;
  }
  else {
    if (bVar1 - 0xb < 2) {
      if (fUseBuf == 0) {
        if (vTemp->nSize < 1) goto LAB_003b4750;
        uVar10 = *vTemp->pArray;
      }
      else {
        if (vTemp->nSize < 1) {
LAB_003b4750:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar10 = *vTemp->pArray;
        pGVar9 = Gia_ManAppendObj(pNew);
        if ((int)uVar10 < 0) {
LAB_003b48cd:
          __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x30c,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
        }
        if (pNew->nObjs <= (int)(uVar10 >> 1)) goto LAB_003b48cd;
        pGVar4 = pNew->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + (uint)pNew->nObjs <= pGVar9)) {
LAB_003b47d5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar16 = (ulong)(((uint)((int)pGVar9 - (int)pGVar4) >> 2) * -0x55555555 - (uVar10 >> 1) &
                        0x1fffffff);
        *(ulong *)pGVar9 =
             (ulong)((uVar10 & 1) << 0x1d) |
             (ulong)(uVar10 & 1) << 0x3d | *(ulong *)pGVar9 & 0xc0000000c0000000 | uVar16 << 0x20 |
             uVar16;
        pNew->nBufs = pNew->nBufs + 1;
        pGVar4 = pNew->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) goto LAB_003b47d5;
        uVar10 = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      }
      if ((int)uVar10 < 0) {
LAB_003b4709:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar7 = (uint)(bVar1 == 0xc);
    }
    else {
      if (bVar1 - 0xd < 2) {
        if (vTemp->nSize < 1) {
          uVar7 = 1;
        }
        else {
          uVar7 = 1;
          lVar15 = 0;
          do {
            uVar7 = Gia_ManAppendAnd2(pNew,uVar7,vTemp->pArray[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 < vTemp->nSize);
          if ((int)uVar7 < 0) goto LAB_003b4709;
        }
        bVar17 = bVar1 == 0xe;
      }
      else if (bVar1 - 0xf < 2) {
        if (vTemp->nSize < 1) {
          uVar7 = 0;
        }
        else {
          uVar7 = 1;
          lVar15 = 0;
          do {
            if ((vTemp->pArray[lVar15] < 0) ||
               (uVar7 = Gia_ManAppendAnd2(pNew,uVar7,vTemp->pArray[lVar15] ^ 1), (int)uVar7 < 0)) {
LAB_003b47b6:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < vTemp->nSize);
          uVar7 = uVar7 ^ 1;
        }
        bVar17 = bVar1 == 0x10;
      }
      else {
        if (1 < bVar1 - 0x11) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                        ,0x304,
                        "int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
        }
        if (vTemp->nSize < 1) {
          uVar7 = 0;
        }
        else {
          lVar15 = 0;
          uVar16 = 0;
          do {
            uVar10 = vTemp->pArray[lVar15];
            uVar7 = (uint)uVar16;
            if (fUseXors == 0) {
              if (((int)uVar10 < 0) || ((int)uVar7 < 0)) goto LAB_003b47b6;
              uVar8 = Gia_ManAppendAnd2(pNew,uVar7 ^ 1,uVar10);
              uVar10 = Gia_ManAppendAnd2(pNew,uVar7,uVar10 ^ 1);
              if (((int)uVar8 < 0) || ((int)uVar10 < 0)) goto LAB_003b47b6;
              uVar10 = Gia_ManAppendAnd2(pNew,uVar8 ^ 1,uVar10 ^ 1);
              if ((int)uVar10 < 0) goto LAB_003b4709;
              uVar12 = (ulong)(uVar10 ^ 1);
            }
            else if (pNew->fGiaSimple == 0) {
              if ((int)uVar7 < 2) {
                if (uVar7 != 0) {
                  if ((int)uVar10 < 0) goto LAB_003b47b6;
                  uVar10 = uVar10 ^ 1;
                }
                uVar12 = (ulong)uVar10;
              }
              else {
                uVar12 = 0;
                if ((int)uVar10 < 2) {
                  uVar12 = (ulong)(uVar7 ^ uVar10 != 0);
                }
                else if ((uVar7 != uVar10) && (uVar12 = 1, (uVar10 ^ uVar7) != 1)) {
                  pGVar9 = Gia_ManAppendObj(pNew);
                  goto LAB_003b4462;
                }
              }
            }
            else {
              pGVar9 = Gia_ManAppendObj(pNew);
              if ((int)uVar7 < 0) goto LAB_003b488f;
LAB_003b4462:
              uVar5 = (uint)(uVar16 >> 1);
              uVar8 = pNew->nObjs;
              if ((int)uVar8 <= (int)uVar5) {
LAB_003b488f:
                __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
              }
              if (((int)uVar10 < 0) || (uVar11 = uVar10 >> 1, uVar8 <= uVar11)) {
                __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
              }
              if (uVar5 == uVar11) {
                __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x2d7,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
              }
              pGVar4 = pNew->pObjs;
              iVar6 = (int)pGVar9;
              if (uVar11 < uVar5) {
                if (pGVar4 + uVar8 <= pGVar9 || pGVar9 < pGVar4) goto LAB_003b47d5;
                uVar16 = *(ulong *)pGVar9;
                uVar12 = (ulong)((uVar7 & 1) << 0x1d |
                                ((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar5 &
                                0x1fffffff);
                *(ulong *)pGVar9 = uVar12 | uVar16 & 0xffffffffc0000000;
                pGVar4 = pNew->pObjs;
                if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) goto LAB_003b47d5;
                uVar16 = (ulong)(uVar10 & 1) << 0x3d |
                         (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar11 &
                                0x1fffffff) << 0x20 | uVar12 | uVar16 & 0xc0000000c0000000;
              }
              else {
                if (pGVar4 + uVar8 <= pGVar9 || pGVar9 < pGVar4) goto LAB_003b47d5;
                uVar12 = (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar5 &
                                0x1fffffff) << 0x20;
                uVar16 = *(ulong *)pGVar9;
                uVar13 = (ulong)(uVar7 & 1) << 0x3d;
                *(ulong *)pGVar9 = uVar13 | uVar16 & 0xc0000000ffffffff | uVar12;
                pGVar4 = pNew->pObjs;
                if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) goto LAB_003b47d5;
                uVar16 = (ulong)((uVar10 & 1) << 0x1d) |
                         uVar13 | uVar16 & 0xc0000000c0000000 | uVar12 |
                         (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar11 &
                                0x1fffffff);
              }
              *(ulong *)pGVar9 = uVar16;
              pNew->nXors = pNew->nXors + 1;
              pGVar4 = pNew->pObjs;
              if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) goto LAB_003b47d5;
              uVar12 = (ulong)(uint)((int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556);
            }
            uVar7 = (uint)uVar12;
            lVar15 = lVar15 + 1;
            uVar16 = uVar12;
          } while (lVar15 < vTemp->nSize);
          if ((int)uVar7 < 0) goto LAB_003b4709;
        }
        bVar17 = bVar1 == 0x12;
      }
      uVar10 = (uint)bVar17;
    }
    uVar10 = uVar10 ^ uVar7;
  }
  return uVar10;
}

Assistant:

int Acb_ObjToGia2( Gia_Man_t * pNew, int fUseBuf, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp, int fUseXors )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_BIT_INV ) 
    {
        Res = fUseBuf ? Gia_ManAppendBuf(pNew, Vec_IntEntry(vTemp, 0)) : Vec_IntEntry(vTemp, 0);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_INV );
    }
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendAnd2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendOr2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = fUseXors ? Gia_ManAppendXorReal2(pNew, Res, iFanin) : Gia_ManAppendXor2(pNew, Res, iFanin);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}